

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandStarted
          (BuildSystemFrontendDelegate *this,Command *command)

{
  SmallVectorStorage<char,_64U> *pSVar1;
  FILE *__stream;
  int iVar2;
  _func_int **pp_Var3;
  char *pcVar4;
  SmallString<64U> description;
  SmallString<64U> local_70;
  
  iVar2 = (*(command->super_JobDescriptor)._vptr_JobDescriptor[5])(command);
  if ((char)iVar2 == '\0') {
    return;
  }
  pSVar1 = &local_70.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>;
  local_70.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_70.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  pp_Var3 = (command->super_JobDescriptor)._vptr_JobDescriptor;
  local_70.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = pSVar1;
  if (*(char *)(*(long *)(*(long *)((long)this->impl + 0x30) + 0x10) + 2) == '\0') {
    (*pp_Var3[3])(command,&local_70);
    if (local_70.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size != 0) goto LAB_001564d3;
    pp_Var3 = (command->super_JobDescriptor)._vptr_JobDescriptor;
  }
  (*pp_Var3[4])(command,&local_70);
LAB_001564d3:
  __stream = _stdout;
  pcVar4 = llvm::SmallString<64U>::c_str(&local_70);
  fprintf(__stream,"%s\n",pcVar4);
  fflush(_stdout);
  if ((SmallVectorStorage<char,_64U> *)
      local_70.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX != pSVar1) {
    free(local_70.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void BuildSystemFrontendDelegate::commandStarted(Command* command) {
  // Don't report status if opted out by the command.
  if (!command->shouldShowStatus()) {
    return;
  }

  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);

  // Log the command.
  //
  // FIXME: Design the logging and status output APIs.
  SmallString<64> description;
  if (impl->frontend->invocation.showVerboseStatus) {
    command->getVerboseDescription(description);
  } else {
    command->getShortDescription(description);

    // If the short description is empty, always show the verbose one.
    if (description.empty()) {
      command->getVerboseDescription(description);
    }
  }
  fprintf(stdout, "%s\n", description.c_str());
  fflush(stdout);
}